

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O0

double __thiscall
IndividualBeliefJESP::Update
          (IndividualBeliefJESP *this,IndividualBeliefJESP *b_prev,Index lastAI,Index newOI,
          JointPolicyPureVector *jpol)

{
  uint uVar1;
  value_type vVar2;
  ulong uVar3;
  size_t sVar4;
  reference pvVar5;
  size_type sVar6;
  IndividualBeliefJESP *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *oHist_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  reference pvVar8;
  value_type in_ECX;
  ulong uVar9;
  value_type in_EDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  double dVar10;
  Index eI;
  double Pso_sa;
  Index next_eI;
  Index next_oHist_j;
  Index j_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_oHist_others;
  double Po_as;
  Index joI;
  Index j_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  Index JO_o;
  double Ps_as;
  Index next_sI;
  Index jaI;
  Index act_j;
  Index prev_oHist_j;
  Index ag_j;
  Index j_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev_oHist_others;
  Index prev_sI;
  double probPrev_eI;
  Index prev_eI;
  Index nrO_j;
  Index j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrO_others;
  Scope otherAgentIndices;
  size_t nrJO_others;
  vector<double,_std::allocator<double>_> newJB_unnorm;
  double Po_ba;
  Index in_stack_fffffffffffffce8;
  Index in_stack_fffffffffffffcec;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffcf0;
  StateDistributionVector *in_stack_fffffffffffffcf8;
  allocator_type *in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint uVar11;
  undefined4 in_stack_fffffffffffffd14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd20;
  value_type in_stack_fffffffffffffd2c;
  value_type in_stack_fffffffffffffd30;
  Index in_stack_fffffffffffffd34;
  PlanningUnitMADPDiscrete *this_01;
  reference in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  value_type in_stack_fffffffffffffd6c;
  uint local_1b4;
  uint local_19c;
  uint local_174;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170 [2];
  uint local_134;
  double local_130;
  uint local_124;
  undefined4 local_120;
  value_type local_11c;
  value_type local_118;
  value_type local_114;
  uint local_110;
  undefined1 local_108 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  Index local_d4;
  double local_d0;
  uint local_c4;
  ulong local_c0;
  undefined4 local_b8;
  uint local_b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  ulong local_80;
  double local_60;
  undefined8 local_40;
  long *local_20;
  value_type local_18;
  value_type local_14;
  long *local_10;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 2));
  local_40 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x9c6daf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),in_stack_fffffffffffffd08
             ,(value_type_conflict3 *)in_stack_fffffffffffffd00,
             (allocator_type *)in_stack_fffffffffffffcf8);
  StateDistributionVector::operator=(in_stack_fffffffffffffcf8,(SDV *)in_stack_fffffffffffffcf0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd00);
  std::allocator<double>::~allocator((allocator<double> *)0x9c6e0b);
  local_60 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x9c6e24);
  local_80 = 1;
  Scope::Scope((Scope *)in_stack_fffffffffffffcf0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9c6e4c);
  for (local_b4 = 0; uVar9 = (ulong)local_b4, uVar3 = (**(code **)(*(long *)in_RDI[5] + 0x30))(),
      uVar9 < uVar3; local_b4 = local_b4 + 1) {
    if (local_b4 != *(uint *)(in_RDI + 8)) {
      sVar4 = PlanningUnitMADPDiscrete::GetNrObservations
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
      local_b8 = (undefined4)sVar4;
      local_80 = local_80 * (sVar4 & 0xffffffff);
      local_c0 = sVar4 & 0xffffffff;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcf0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd00,
                 (value_type_conflict1 *)in_stack_fffffffffffffcf8);
    }
  }
  for (local_c4 = 0; uVar11 = local_c4, uVar1 = (**(code **)(*local_10 + 0x70))(), uVar11 < uVar1;
      local_c4 = local_c4 + 1) {
    local_d0 = (double)(**(code **)(*local_10 + 0x48))(local_10,local_c4);
    if (0.0 < local_d0) {
      local_d4 = GetStateIndex((IndividualBeliefJESP *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                               in_stack_fffffffffffffd2c);
      GetOthersObservationHistIndex
                ((IndividualBeliefJESP *)
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (Index)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9c70e0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9c710c);
      vVar2 = local_14;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffcf0,
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      *pvVar5 = vVar2;
      for (local_110 = 0; uVar3 = (ulong)local_110,
          sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98),
          uVar3 < sVar6; local_110 = local_110 + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_98,(ulong)local_110);
        local_114 = *pvVar5;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_f0,(ulong)local_110);
        local_118 = *pvVar5;
        vVar2 = (**(code **)(*local_20 + 0x98))(local_20,local_114,local_118);
        local_11c = vVar2;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffcf0,
                            CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        *pvVar5 = vVar2;
      }
      local_120 = (**(code **)(*(long *)in_RDI[5] + 0x48))((long *)in_RDI[5],local_108);
      for (local_124 = 0; uVar3 = (ulong)local_124,
          sVar4 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffffcf0), uVar3 < sVar4;
          local_124 = local_124 + 1) {
        local_130 = PlanningUnitMADPDiscrete::GetTransitionProbability
                              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                               in_stack_fffffffffffffce8,0);
        if (0.0 < local_130) {
          for (local_134 = 0; local_134 < local_80; local_134 = local_134 + 1) {
            std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9c73ba);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
            std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9c73e6);
            vVar2 = local_18;
            this_00 = (IndividualBeliefJESP *)
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 in_stack_fffffffffffffcf0,
                                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
            *(value_type *)&this_00->super_Belief = vVar2;
            IndexTools::JointToIndividualIndices
                      (in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
            local_174 = 0;
            while( true ) {
              oHist_others = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_174
              ;
              pvVar7 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98);
              if (pvVar7 <= oHist_others) break;
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffffcf0,
                                  CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              in_stack_fffffffffffffd6c = *pvVar5;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffffcf0,
                         CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              in_stack_fffffffffffffd60 =
                   std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffcf0,
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              *in_stack_fffffffffffffd60 = in_stack_fffffffffffffd6c;
              local_174 = local_174 + 1;
            }
            PlanningUnitMADPDiscrete::IndividualToJointObservationIndices
                      (in_stack_fffffffffffffcf0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
            dVar10 = PlanningUnitMADPDiscrete::GetObservationProbability
                               (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                                in_stack_fffffffffffffce8,0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9c75e3);
            for (local_19c = 0;
                sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_98),
                local_19c < sVar6; local_19c = local_19c + 1) {
              this_01 = (PlanningUnitMADPDiscrete *)in_RDI[5];
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_fffffffffffffcf0,
                                  CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
              in_stack_fffffffffffffd2c = *pvVar5;
              pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 (&local_f0,(ulong)local_19c);
              in_stack_fffffffffffffd30 = *pvVar5;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (local_170,(ulong)local_19c);
              in_stack_fffffffffffffd34 =
                   PlanningUnitMADPDiscrete::GetSuccessorOHI
                             (this_01,in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,
                              in_stack_fffffffffffffd2c);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffffd00,(value_type_conflict1 *)in_stack_fffffffffffffcf8
                        );
            }
            GetAugmentedStateIndex(this_00,vVar2,oHist_others);
            dVar10 = dVar10 * local_130 * local_d0;
            in_stack_fffffffffffffd20 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcf0,
                            CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
            (in_stack_fffffffffffffd20->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(dVar10 + (double)(in_stack_fffffffffffffd20->
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            )._M_impl.super__Vector_impl_data._M_start);
            local_60 = dVar10 + local_60;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd00);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd00);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffd00);
          }
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd00);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd00);
    }
  }
  local_1b4 = 0;
  while (uVar11 = local_1b4, uVar1 = (**(code **)(*in_RDI + 0x70))(), uVar11 < uVar1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcf0,
                        CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    dVar10 = *pvVar8 / local_60;
    in_stack_fffffffffffffd00 =
         (allocator_type *)
         std::vector<double,_std::allocator<double>_>::at
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcf0,
                    CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    *(double *)in_stack_fffffffffffffd00 = dVar10;
    local_1b4 = local_1b4 + 1;
  }
  dVar10 = local_60;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00);
  Scope::~Scope((Scope *)0x9c7963);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd00);
  return dVar10;
}

Assistant:

double IndividualBeliefJESP::Update(
        const IndividualBeliefJESP& b_prev, 
           Index lastAI, Index newOI, const JointPolicyPureVector* jpol)
{
    //set all probs of this belief to 0
    _m_b = vector<double>(_m_b.size(), 0.0);

    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;

    size_t nrJO_others = 1;
    Scope otherAgentIndices;
    vector<size_t> nrO_others; 
    for(Index j=0; j < _m_pumadp->GetNrAgents(); j++)
    {
        if(j == _m_agentI)
            continue;
        //else
        Index nrO_j =  _m_pumadp->GetNrObservations(j);
        nrJO_others *= nrO_j;
        nrO_others.push_back(nrO_j);
        otherAgentIndices.push_back(j);
    }

    for(Index prev_eI=0; prev_eI < b_prev.Size(); prev_eI++)
    {
        double probPrev_eI=b_prev.Get(prev_eI);
        if(probPrev_eI>0)// only need to do this if this previous eI is possible
        {
            Index prev_sI = b_prev.GetStateIndex(prev_eI);
            vector<Index> prev_oHist_others = b_prev.
                GetOthersObservationHistIndex(prev_eI);
            vector<Index> actions(_m_nrAgents);
            actions.at(_m_agentI) = lastAI;
            for(Index j=0; j < otherAgentIndices.size(); j++)
            {
                Index ag_j = otherAgentIndices[j];
                Index prev_oHist_j = prev_oHist_others[j];//not ag_j!!!
                Index act_j = jpol->GetActionIndex(ag_j, prev_oHist_j);
                actions.at(ag_j) = act_j;
            }
            Index jaI = _m_pumadp->IndividualToJointActionIndices(actions);
            
            for(Index next_sI=0; next_sI < _m_pumadp->GetNrStates(); next_sI++)
            {
                //note we do not loop over all possible next_eI, because *a lot*
                //of transitions will be 0 ( if next_oHistJ != (prev_oHistJ, oJ) )
                //
                //rather we now loop over all possible oJ (observations of others)
                double Ps_as = _m_pumadp->
                    GetTransitionProbability(prev_sI, jaI, next_sI);
                
                if(Ps_as>0) // only need to do this if this transition can occur
                {
                    for(Index JO_o=0; JO_o < nrJO_others; JO_o++)
                    {
                        vector<Index> oIs(_m_nrAgents);
                        oIs.at(_m_agentI) = newOI; // `our' observation is fixed
                        vector<Index> oIs_others = IndexTools::JointToIndividualIndices(
                            JO_o, nrO_others);
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                            oIs.at( otherAgentIndices.at(j) ) = oIs_others.at(j);
                        
                        Index joI = _m_pumadp->IndividualToJointObservationIndices(oIs);
                        //compute P(joI | jaI,s')
                        double Po_as = _m_pumadp->GetObservationProbability(
                            jaI, next_sI, joI);
                        
                        //prob of next_eI = <next_sI, (oHist_others, oIs_others)>
                        //AND prev_sI can now be computed.
                        //
                        //first, however, lets find the index, next_eI, for 
                        // <next_sI, (oHist_others, oIs_others)>
                    
                        // first find the next_oHist_others indices.
                        vector<Index> next_oHist_others;
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                        {
                            Index next_oHist_j = _m_pumadp->GetSuccessorOHI(otherAgentIndices.at(j), 
                                                                            prev_oHist_others[j],
                                                                            oIs_others[j] );
                            next_oHist_others.push_back(next_oHist_j);
                        }
                        Index next_eI = GetAugmentedStateIndex(next_sI, 
                                                               next_oHist_others);

                        //p += P(oi | ai, <s',oH'>) * P(<s',oH'>|<s,oH>,ai) * b(<s,oH>)
                        //      = P(oi, <s',oH'>|<s,oH'>,ai) * b(<s,oH>)
                        //      = P(s', jo | s, ja) b(<s,oH>)  //ja=<ai, aj>,aj=pol(oHj)
                        //      = P(jo|ja,s')*P(s'|s,ja)
                        double Pso_sa =  Po_as * Ps_as * probPrev_eI;
                        _m_b.at(next_eI) += Pso_sa;
                        Po_ba += Pso_sa; //running sum of P(oi|b,ai)
                    }
                }
            }
        }
    }
    for(Index eI=0; eI < this->Size(); eI++)
        _m_b.at(eI) = _m_b.at(eI) / Po_ba;

    return(Po_ba);

}